

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ArgumentMismatch * CLI::ArgumentMismatch::AtMost(string *name,int num,size_t received)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_f0 [16];
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_c0 [12];
  int in_stack_ffffffffffffff4c;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  ArgumentMismatch *in_stack_ffffffffffffff70;
  string local_80 [32];
  string local_60 [32];
  string local_40 [64];
  
  __lhs = in_RDI;
  ::std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  ::std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ::std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff38);
  ::std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ArgumentMismatch(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::~string(local_40);
  ::std::__cxx11::string::~string(local_f0);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_c0);
  ::std::__cxx11::string::~string(local_a0);
  return (ArgumentMismatch *)__lhs;
}

Assistant:

static ArgumentMismatch AtMost(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At Most " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }